

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

int __thiscall
CVmObjIterIdx::getp_reset_iter(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjIterIdx *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vm_val_t *in_stack_ffffffffffffffc8;
  CVmObjIterIdx *this_00;
  
  this_00 = in_RDI;
  if ((getp_reset_iter(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_reset_iter(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_reset_iter::desc,0);
    __cxa_guard_release(&getp_reset_iter(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar1 == 0) {
    get_first_valid((CVmObjIterIdx *)0x3671ca);
    set_cur_index(this_00,in_ESI,(long)in_RDX);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_reset_iter(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set the index to the first valid index minus one */
    set_cur_index(vmg_ self, get_first_valid() - 1);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}